

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O0

void __thiscall
vmdict_TrieNode::vmdict_TrieNode(vmdict_TrieNode *this,vmdict_TrieNode *nxt,wchar_t c)

{
  wchar_t c_local;
  vmdict_TrieNode *nxt_local;
  vmdict_TrieNode *this_local;
  
  this->ch = c;
  this->word_cnt = 0;
  this->nxt = nxt;
  this->chi = (vmdict_TrieNode *)0x0;
  return;
}

Assistant:

vmdict_TrieNode(vmdict_TrieNode *nxt, wchar_t c)
    {
        /* remember the transition character from our parent to us */
        ch = c;

        /* we don't have any words in this node yet */
        word_cnt = 0;

        /* remember our next sibling link */
        this->nxt = nxt;

        /* we don't have any children yet */
        chi = 0;
    }